

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::AtomicCmpxchg*,wasm::Type>
          (ValidationInfo *this,Type left,Type right,AtomicCmpxchg *curr,char *text,Function *func)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  ValidationInfo *local_1d8;
  uintptr_t local_1c0;
  ostringstream local_1b8 [8];
  ostringstream ss;
  Function *func_local;
  char *text_local;
  AtomicCmpxchg *curr_local;
  ValidationInfo *this_local;
  Type right_local;
  Type left_local;
  
  this_local = (ValidationInfo *)right.id;
  right_local = left;
  bVar1 = wasm::Type::operator!=(&right_local,(Type *)&this_local);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    local_1c0 = right_local.id;
    poVar2 = wasm::operator<<((ostream *)local_1b8,right_local);
    poVar2 = std::operator<<(poVar2," != ");
    local_1d8 = this_local;
    poVar2 = wasm::operator<<(poVar2,(Type)this_local);
    poVar2 = std::operator<<(poVar2,": ");
    std::operator<<(poVar2,text);
    std::__cxx11::ostringstream::str();
    fail<wasm::AtomicCmpxchg*,std::__cxx11::string>(this,&local_1f8,curr,func);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  left_local.id._7_1_ = !bVar1;
  return left_local.id._7_1_;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }